

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  cmCTest *pcVar1;
  undefined8 __s;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  long *plVar6;
  string local_540 [32];
  undefined1 local_520 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_201;
  undefined1 local_200 [8];
  string fileName;
  char *s;
  int size;
  char c;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  char local_24 [2];
  undefined1 local_22;
  istream *piStack_20;
  char buf [4];
  istream *in_local;
  cmParsePHPCoverage *this_local;
  
  piStack_20 = in;
  std::istream::read((char *)in,(long)local_24);
  local_22 = 0;
  iVar3 = strcmp(local_24,"s:");
  if (iVar3 == 0) {
    s._0_4_ = 0;
    bVar2 = ReadInt(this,piStack_20,(int *)&s);
    if (bVar2) {
      iVar3 = (int)s + 2;
      s._0_4_ = (int)s + 1;
      fileName.field_2._8_8_ = operator_new__((long)iVar3);
      plVar6 = (long *)std::istream::get((char *)piStack_20);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if ((bVar2) && (s._7_1_ != '\"')) {
        if (fileName.field_2._8_8_ != 0) {
          operator_delete__((void *)fileName.field_2._8_8_);
        }
        this_local._7_1_ = false;
      }
      else {
        std::istream::read((char *)piStack_20,fileName.field_2._8_8_);
        __s = fileName.field_2._8_8_;
        *(undefined1 *)(fileName.field_2._8_8_ + (long)((int)s + -1)) = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,(char *)__s,&local_201);
        std::allocator<char>::~allocator(&local_201);
        if (fileName.field_2._8_8_ != 0) {
          operator_delete__((void *)fileName.field_2._8_8_);
        }
        plVar6 = (long *)std::istream::get((char *)piStack_20);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if ((bVar2) && (s._7_1_ != '\"')) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
          poVar4 = std::operator<<((ostream *)local_380,"failed to read close quote\n");
          poVar4 = std::operator<<(poVar4,"read [");
          poVar4 = std::operator<<(poVar4,s._7_1_);
          std::operator<<(poVar4,"]\n");
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                       ,0x9e,pcVar5,false);
          std::__cxx11::string::~string(local_3a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
          this_local._7_1_ = false;
        }
        else {
          bVar2 = ReadCoverageArray(this,piStack_20,(string *)local_200);
          if (bVar2) {
            this_local._7_1_ = true;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_520);
            poVar4 = std::operator<<((ostream *)local_520,"failed to read coverage array for file: "
                                    );
            poVar4 = std::operator<<(poVar4,(string *)local_200);
            std::operator<<(poVar4,"\n");
            pcVar1 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                         ,0xa4,pcVar5,false);
            std::__cxx11::string::~string(local_540);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_520);
            this_local._7_1_ = false;
          }
        }
        std::__cxx11::string::~string((string *)local_200);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,"failed to read start of file info found: [");
    poVar4 = std::operator<<(poVar4,local_24);
    std::operator<<(poVar4,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x88,pcVar5,false);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    char* s = new char[size + 1];
    // read open quote
    if (in.get(c) && c != '"') {
      delete[] s;
      return false;
    }
    // read the string data
    in.read(s, size - 1);
    s[size - 1] = 0;
    std::string fileName = s;
    delete[] s;
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}